

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall ghc::filesystem::path::root_path(path *__return_storage_ptr__,path *this)

{
  ulong *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  undefined8 *puVar4;
  ulong uVar5;
  ulong *local_c0;
  ulong local_b0;
  undefined8 uStack_a8;
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  path local_60;
  path local_40;
  
  root_name(&local_40,this);
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,local_40._path._M_dataplus._M_p,
             local_40._path._M_dataplus._M_p + local_40._path._M_string_length);
  root_directory(&local_60,this);
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,local_60._path._M_dataplus._M_p,
             local_60._path._M_dataplus._M_p + local_60._path._M_string_length);
  uVar5 = 0xf;
  if (local_80 != local_70) {
    uVar5 = local_70[0];
  }
  if (uVar5 < (ulong)(local_98 + local_78)) {
    uVar5 = 0xf;
    if (local_a0 != local_90) {
      uVar5 = local_90[0];
    }
    if ((ulong)(local_98 + local_78) <= uVar5) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_80);
      goto LAB_001998e3;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_a0);
LAB_001998e3:
  local_c0 = &local_b0;
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_b0 = *puVar1;
    uStack_a8 = puVar4[3];
  }
  else {
    local_b0 = *puVar1;
    local_c0 = (ulong *)*puVar4;
  }
  sVar3 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  paVar2 = &(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar2;
  if (local_c0 == &local_b0) {
    paVar2->_M_allocated_capacity = local_b0;
    *(undefined8 *)((long)&(__return_storage_ptr__->_path).field_2 + 8) = uStack_a8;
  }
  else {
    (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)local_c0;
    (__return_storage_ptr__->_path).field_2._M_allocated_capacity = local_b0;
  }
  (__return_storage_ptr__->_path)._M_string_length = sVar3;
  local_b0 = local_b0 & 0xffffffffffffff00;
  postprocess_path_with_format(__return_storage_ptr__,(format)sVar3);
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._path._M_dataplus._M_p != &local_60._path.field_2) {
    operator_delete(local_60._path._M_dataplus._M_p,local_60._path.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._path._M_dataplus._M_p != &local_40._path.field_2) {
    operator_delete(local_40._path._M_dataplus._M_p,local_40._path.field_2._M_allocated_capacity + 1
                   );
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::root_path() const
{
    return path(root_name().string() + root_directory().string(), native_format);
}